

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

void al_insert_path_component(ALLEGRO_PATH *path,int i,char *s)

{
  undefined8 *puVar1;
  ALLEGRO_USTR *pAVar2;
  _AL_VECTOR *in_RDX;
  int in_ESI;
  long in_RDI;
  ALLEGRO_USTR **slot;
  undefined8 in_stack_ffffffffffffffe0;
  uint index;
  
  index = (uint)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  if (in_ESI < 0) {
    _al_vector_size((_AL_VECTOR *)(in_RDI + 0x10));
  }
  puVar1 = (undefined8 *)_al_vector_alloc_mid(in_RDX,index);
  pAVar2 = al_ustr_new((char *)0x17c624);
  *puVar1 = pAVar2;
  return;
}

Assistant:

void al_insert_path_component(ALLEGRO_PATH *path, int i, const char *s)
{
   ALLEGRO_USTR **slot;
   ASSERT(path);
   ASSERT(i <= (int)_al_vector_size(&path->segments));

   if (i < 0)
      i = _al_vector_size(&path->segments) + i;

   ASSERT(i >= 0);

   slot = _al_vector_alloc_mid(&path->segments, i);
   (*slot) = al_ustr_new(s);
}